

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspa.c
# Opt level: O0

aspa_status aspa_table_remove_node(aspa_table *aspa_table,aspa_store_node **node,_Bool notify)

{
  long lVar1;
  aspa_array *array_00;
  rtr_socket *rtr_socket;
  aspa_record *record;
  long in_FS_OFFSET;
  ulong local_48;
  size_t i;
  rtr_socket *socket;
  aspa_array *array;
  _Bool notify_local;
  aspa_store_node **node_local;
  aspa_table *aspa_table_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (node == (aspa_store_node **)0x0) {
    aspa_table_local._4_4_ = ASPA_ERROR;
  }
  else if (*node == (aspa_store_node *)0x0) {
    aspa_table_local._4_4_ = ASPA_SUCCESS;
  }
  else {
    array_00 = (*node)->aspa_array;
    rtr_socket = (*node)->rtr_socket;
    aspa_store_remove_node(node);
    if (array_00 == (aspa_array *)0x0) {
      aspa_table_local._4_4_ = ASPA_SUCCESS;
    }
    else {
      if (notify) {
        for (local_48 = 0; local_48 < array_00->size; local_48 = local_48 + 1) {
          record = aspa_array_get_record(array_00,local_48);
          aspa_table_notify_clients(aspa_table,record,rtr_socket,ASPA_REMOVE);
        }
      }
      aspa_array_free(array_00,true);
      aspa_table_local._4_4_ = ASPA_SUCCESS;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return aspa_table_local._4_4_;
}

Assistant:

static enum aspa_status aspa_table_remove_node(struct aspa_table *aspa_table, struct aspa_store_node **node,
					       bool notify)
{
	if (!node)
		return ASPA_ERROR;

	if (!*node)
		// Doesn't exist anymore
		return ASPA_SUCCESS;

	struct aspa_array *array = (*node)->aspa_array;
	struct rtr_socket *socket = (*node)->rtr_socket;

	// Remove node for socket
	aspa_store_remove_node(node);

	if (!array)
		// Doesn't exist anymore
		return ASPA_SUCCESS;

	// Notify clients about these records being removed
	if (notify) {
		for (size_t i = 0; i < array->size; i++)
			aspa_table_notify_clients(aspa_table, aspa_array_get_record(array, i), socket, false);
	}

	// Release all records and their provider sets
	aspa_array_free(array, true);

	return ASPA_SUCCESS;
}